

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

void __thiscall CVmObjStringBuffer::load_image_data(CVmObjStringBuffer *this,char *ptr,size_t siz)

{
  uint uVar1;
  uint uVar2;
  vm_strbuf_ext *pvVar3;
  uint uVar4;
  uint inc;
  long lVar5;
  uint uVar6;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  uVar4 = *(uint *)ptr;
  uVar6 = 0x7fffffff;
  if (uVar4 < 0x7fffffff) {
    uVar6 = uVar4;
  }
  if (uVar6 < 0x11) {
    uVar6 = 0x10;
  }
  inc = 0x7fffffff;
  if (*(uint *)(ptr + 4) < 0x7fffffff) {
    inc = *(uint *)(ptr + 4);
  }
  uVar1 = *(uint *)(ptr + 8);
  if (inc < 0x11) {
    inc = 0x10;
  }
  uVar2 = uVar1;
  if (uVar6 < uVar1) {
    uVar2 = uVar6;
  }
  pvVar3 = vm_strbuf_ext::alloc_ext(this,uVar6,inc);
  (this->super_CVmObject).ext_ = (char *)pvVar3;
  pvVar3->len = uVar2;
  uVar6 = 0x7fffffff;
  if (uVar4 < 0x7fffffff) {
    uVar6 = uVar4;
  }
  uVar4 = 0x10;
  if (0x10 < uVar6) {
    uVar4 = uVar6;
  }
  if (uVar1 <= uVar4) {
    uVar4 = uVar1;
  }
  for (lVar5 = 0; uVar4 != (uint)lVar5; lVar5 = lVar5 + 1) {
    pvVar3->buf[lVar5] = (uint)*(ushort *)(ptr + lVar5 * 2 + 0xc);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the string and allocation data from the image data */
    uint32_t alo = osrp4(ptr);
    uint32_t inc = osrp4(ptr + 4);
    uint32_t len = osrp4(ptr + 8);

    /* limit the sizes */
    if (alo < 16)
        alo = 16;
    else if (alo > STRBUF_MAX_LEN)
        alo = STRBUF_MAX_LEN;

    if (inc < 16)
        inc = 16;
    else if (inc > STRBUF_MAX_LEN)
        inc = STRBUF_MAX_LEN;

    if (len > alo)
        len = alo;

    /* skip to the string characters */
    ptr += 12;

    /* allocate the extension */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* set the length */
    ext->len = len;

    /* read the string data into the buffer */
    for (wchar_t *dst = ext->buf ; len != 0 ;
         *dst++ = osrp2(ptr), ptr += 2, --len) ;
}